

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void digest_str(uchar *digest,size_t digest_len,char *str,size_t max_len)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  
  uVar1 = digest_len * 2 + 1;
  if (uVar1 < max_len) {
    max_len = uVar1;
  }
  str[max_len - 1] = '\0';
  for (uVar2 = 0; (ulong)uVar2 < max_len - 1; uVar2 = uVar2 + 1) {
    bVar3 = digest[uVar2 >> 1] & 0xf;
    if ((uVar2 & 1) == 0) {
      bVar3 = digest[uVar2 >> 1] >> 4;
    }
    str[uVar2] = "0123456789abcdef"[bVar3];
  }
  return;
}

Assistant:

static void digest_str(const unsigned char *digest, size_t digest_len, char *str, size_t max_len)
{
	unsigned i;
	if(max_len > digest_len * 2 + 1)
	{
		max_len = digest_len * 2 + 1;
	}
	str[max_len - 1] = 0;
	max_len -= 1;
	for(i = 0; i < max_len; i++)
	{
		static const char HEX[] = "0123456789abcdef";
		int index = i / 2;
		if(i % 2 == 0)
		{
			str[i] = HEX[digest[index] >> 4];
		}
		else
		{
			str[i] = HEX[digest[index] & 0xf];
		}
	}
}